

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

hash_t __thiscall
TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CountUsed
          (TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_> *this)

{
  hash_t hVar1;
  hash_t hVar2;
  Node *pNVar3;
  bool bVar4;
  
  hVar2 = this->Size;
  pNVar3 = this->Nodes;
  hVar1 = 0;
  while (bVar4 = hVar2 != 0, hVar2 = hVar2 - 1, bVar4) {
    hVar1 = hVar1 + (pNVar3->Next != (Node *)0x1);
    pNVar3 = pNVar3 + 1;
  }
  if (hVar1 == this->NumUsed) {
    return hVar1;
  }
  __assert_fail("used == NumUsed",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                ,0x2b5,
                "hash_t TMap<int, FDoomEdEntry>::CountUsed() const [KT = int, VT = FDoomEdEntry, HashTraits = THashTraits<int>, ValueTraits = TValueTraits<FDoomEdEntry>]"
               );
}

Assistant:

hash_t CountUsed() const
	{
#ifdef _DEBUG
		hash_t used = 0;
		hash_t ct = Size;
		for (Node *n = Nodes; ct-- > 0; ++n)
		{
			if (!n->IsNil())
			{
				++used;
			}
		}
		assert (used == NumUsed);
#endif
		return NumUsed;
	}